

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QHash<QByteArray,QByteArray> *this,QByteArray *key,QByteArray *args)

{
  Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QByteArray local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
    local_38.d.d = (Data *)0x0;
LAB_0021af1f:
    pDVar1 = (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0;
LAB_0021af40:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this = pDVar1;
LAB_0021af48:
    pVar2 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
    QHash<QByteArray,_QByteArray>::~QHash((QHash<QByteArray,_QByteArray> *)&local_38);
  }
  else {
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      local_38.d.d = (Data *)pDVar1;
      if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pDVar1 = *(Data<QHashPrivate::Node<QByteArray,_QByteArray>_> **)this;
        if (pDVar1 == (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) goto LAB_0021af1f;
      }
      if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_0021af40;
      goto LAB_0021af48;
    }
    if (pDVar1->size < pDVar1->numBuckets >> 1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        pVar2 = (piter)emplace_helper<QByteArray_const&>(this,key,args);
        return (iterator)pVar2;
      }
      goto LAB_0021afde;
    }
    local_38.d.d = (args->d).d;
    local_38.d.ptr = (args->d).ptr;
    local_38.d.size = (args->d).size;
    if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_38.d.d !=
        (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      LOCK();
      (((QArrayData *)&((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_38.d.d)->ref)->
      ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_38.d.d)->ref
            )->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pVar2 = (piter)QHash<QByteArray,_QByteArray>::emplace_helper<QByteArray>
                             ((QHash<QByteArray,_QByteArray> *)this,key,&local_38);
    if ((Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)local_38.d.d !=
        (Data<QHashPrivate::Node<QByteArray,_QByteArray>_> *)0x0) {
      LOCK();
      (((RefCount *)&(local_38.d.d)->super_QArrayData)->atomic)._q_value.super___atomic_base<int>.
      _M_i = (((RefCount *)&(local_38.d.d)->super_QArrayData)->atomic)._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((RefCount *)&(local_38.d.d)->super_QArrayData)->atomic)._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0021afde:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }